

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_join_cluster_req(raft_server *this,req_msg *req)

{
  long *plVar1;
  pointer psVar2;
  element_type *peVar3;
  _func_int **pp_Var4;
  buffer *buf;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<cornerstone::resp_msg> sVar6;
  ptr<resp_msg> pVar7;
  undefined1 auVar8 [16];
  int local_44;
  cluster_config local_40;
  
  local_40.log_idx_ =
       (ulong)((req[3].log_entries_.
                super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_44 = 0xd;
  local_40.servers_.
  super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ._M_impl._M_node._M_size._4_4_ = *(undefined4 *)(in_RDX + 0x14);
  sVar6 = std::make_shared<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int>
                    ((unsigned_long *)this,(msg_type *)&local_40,&local_44,
                     (int *)((long)&(req->super_msg_base).term_ + 4));
  if ((*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38) == 0x10) &&
     (*(int *)(**(long **)(in_RDX + 0x38) + 8) == 2)) {
    if (*(char *)((long)&req->last_log_idx_ + 2) != '\x01') {
      *(undefined1 *)((long)&req->last_log_idx_ + 2) = 1;
      *(undefined4 *)
       &req[3].log_entries_.
        super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ._M_impl.super__Vector_impl_data._M_start = 1;
      *(undefined4 *)&(req->super_msg_base).term_ = *(undefined4 *)(in_RDX + 0x14);
      *(undefined8 *)&(req->super_msg_base).dst_ = 0;
      req->last_log_term_ = 0;
      psVar2 = req[3].log_entries_.
               super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      *(undefined4 *)
       &(psVar2->super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
        ._M_pi = 0xffffffff;
      (psVar2->super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(element_type **)(in_RDX + 8);
      peVar3 = (((req->log_entries_).
                 super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (**(code **)(peVar3->term_ + 0x20))
                (peVar3,psVar2,
                 sVar6.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      buf = log_entry::get_buf((log_entry *)**(undefined8 **)(in_RDX + 0x38));
      cluster_config::deserialize(&local_40,buf);
      reconfigure((raft_server *)req,(ptr<cluster_config> *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40.prev_log_idx_);
      pp_Var4 = this->_vptr_raft_server;
      auVar8 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
      _Var5._M_pi = auVar8._8_8_;
      pp_Var4[4] = auVar8._0_8_;
      *(undefined1 *)(pp_Var4 + 5) = 1;
      goto LAB_00145a35;
    }
    plVar1 = (long *)req[4].last_log_term_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"this server is already in log syncing mode",
               (allocator<char> *)&local_44);
    (**(code **)(*plVar1 + 0x18))(plVar1,&local_40);
  }
  else {
    plVar1 = (long *)req[4].last_log_term_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "receive an invalid JoinClusterRequest as the log entry value doesn\'t meet the requirements"
               ,(allocator<char> *)&local_44);
    (**(code **)(*plVar1 + 0x18))(plVar1,&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  _Var5._M_pi = extraout_RDX;
LAB_00145a35:
  pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar7.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_join_cluster_req(req_msg& req)
{
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::join_cluster_response, id_, req.get_src()));
    if (entries.size() != 1 || entries[0]->get_val_type() != log_val_type::conf)
    {
        l_->info("receive an invalid JoinClusterRequest as the log entry value doesn't meet the requirements");
        return resp;
    }

    if (catching_up_)
    {
        l_->info("this server is already in log syncing mode");
        return resp;
    }

    catching_up_ = true;
    role_ = srv_role::follower;
    leader_ = req.get_src();
    sm_commit_index_ = 0;
    quick_commit_idx_ = 0;
    state_->set_voted_for(-1);
    state_->set_term(req.get_term());
    ctx_->state_mgr_->save_state(*state_);
    reconfigure(cluster_config::deserialize(entries[0]->get_buf()));
    resp->accept(log_store_->next_slot());
    return resp;
}